

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.c
# Opt level: O0

uint32_t nsync::nsync_counter_add(nsync_counter c,int32_t delta)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  nsync_dll_element_ *e;
  nsync_dll_list_ pnVar4;
  nsync_waiter_s *nw;
  nsync_dll_element_ *p;
  uint32_t value;
  int32_t delta_local;
  nsync_counter c_local;
  
  if (delta == 0) {
    p._0_4_ = std::atomic_load_explicit<unsigned_int>(&c->value,memory_order_acquire);
  }
  else {
    nsync_mu_lock(&c->counter_mu);
    do {
      uVar2 = std::atomic_load_explicit<unsigned_int>(&c->value,memory_order_relaxed);
      iVar3 = atm_cas_relacq_u32_(&c->value,uVar2,uVar2 + delta);
    } while (iVar3 == 0);
    p._0_4_ = delta + uVar2;
    if (delta < 1) {
      if ((uint)p - delta <= (uint)p) {
        uRam0000000000000000 = 0;
      }
    }
    else {
      if (((uint)p == delta) &&
         (uVar2 = std::atomic_load_explicit<unsigned_int>(&c->waited,memory_order_relaxed),
         uVar2 != 0)) {
        uRam0000000000000000 = 0;
      }
      if ((uint)p <= (uint)p - delta) {
        uRam0000000000000000 = 0;
      }
    }
    if ((uint)p == 0) {
      while (e = nsync_dll_first_(c->waiters), e != (nsync_dll_element_ *)0x0) {
        pvVar1 = e->container;
        pnVar4 = nsync_dll_remove_(c->waiters,e);
        c->waiters = pnVar4;
        std::atomic_store_explicit<unsigned_int>
                  ((atomic<unsigned_int> *)((long)pvVar1 + 0x20),0,memory_order_release);
        nsync_mu_semaphore_v(*(nsync_semaphore **)((long)pvVar1 + 0x28));
      }
    }
    nsync_mu_unlock(&c->counter_mu);
  }
  return (uint)p;
}

Assistant:

uint32_t nsync_counter_add (nsync_counter c, int32_t delta) {
	uint32_t value;
	IGNORE_RACES_START ();
	if (delta == 0) {
		value = ATM_LOAD_ACQ (&c->value);
	} else {
		nsync_mu_lock (&c->counter_mu);
		do {
			value = ATM_LOAD (&c->value);
		} while (!ATM_CAS_RELACQ (&c->value, value, value+delta));
		value += delta;
		if (delta > 0) {
			/* It's illegal to increase the count from zero if
			   there has been a waiter. */
			ASSERT (value != (uint32_t) delta || !ATM_LOAD (&c->waited));
			ASSERT (value > value - delta); /* Crash on overflow. */
		} else {
			ASSERT (value < value - delta); /* Crash on overflow. */
		}
		if (value == 0) {
			nsync_dll_element_ *p;
			while ((p = nsync_dll_first_ (c->waiters)) != NULL) {
				struct nsync_waiter_s *nw = DLL_NSYNC_WAITER (p);
				c->waiters = nsync_dll_remove_ (c->waiters, p);
				ATM_STORE_REL (&nw->waiting, 0);
				nsync_mu_semaphore_v (nw->sem);
			}
		}
		nsync_mu_unlock (&c->counter_mu);
	}
	IGNORE_RACES_END ();
	return (value);
}